

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *window;
  ImGuiWindow *window_00;
  bool bVar1;
  
  window = GImGui->NavWindow;
  if (window == (ImGuiWindow *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((flags & 4U) == 0) {
      window_00 = GImGui->CurrentWindow;
      if (window_00 == (ImGuiWindow *)0x0) {
        __assert_fail("cur_window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x1dbf,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
      }
      if ((flags & 2U) != 0) {
        window_00 = GetCombinedRootWindow(window_00,(flags & 8U) == 0,SUB41((flags & 0x10U) >> 4,0))
        ;
      }
      if ((flags & 1U) != 0) {
        bVar1 = IsWindowChildOf(window,window_00,(flags & 8U) == 0,SUB41((flags & 0x10U) >> 4,0));
        return bVar1;
      }
      bVar1 = window == window_00;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    const bool dock_hierarchy = (flags & ImGuiFocusedFlags_DockHierarchy) != 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
    else
        return (ref_window == cur_window);
}